

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVMValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)401>(Result *__return_storage_ptr__,Model *format)

{
  uint32 uVar1;
  int iVar2;
  bool bVar3;
  int32 iVar4;
  int iVar5;
  SupportVectorClassifier *pSVar6;
  Int64Vector *pIVar7;
  StringVector *pSVar8;
  DenseSupportVectors *pDVar9;
  Type *pTVar10;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *features;
  int iVar11;
  Kernel *kernel;
  string *this;
  undefined1 in_R9B;
  int iVar12;
  int index;
  ModelDescription *pMVar13;
  Result *this_00;
  undefined1 local_108 [44];
  int local_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Result result;
  
  pMVar13 = format->description_;
  if (pMVar13 == (ModelDescription *)0x0) {
    pMVar13 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Result::Result(&result);
  validateDescriptionsAreAllVectorizableTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_108,(CoreML *)&pMVar13->input_,features);
  Result::operator=(&result,(Result *)local_108);
  std::__cxx11::string::~string((string *)(local_108 + 8));
  bVar3 = Result::good(&result);
  if (bVar3) {
    pSVar6 = Specification::Model::supportvectorclassifier(format);
    validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::SupportVectorClassifier>
              ((Result *)local_108,(CoreML *)format,(Model *)pSVar6,(SupportVectorClassifier *)0x0,
               false,(bool)in_R9B);
    Result::operator=(&result,(Result *)local_108);
    std::__cxx11::string::~string((string *)(local_108 + 8));
    bVar3 = Result::good(&result);
    if (bVar3) {
      pSVar6 = Specification::Model::supportvectorclassifier(format);
      kernel = pSVar6->kernel_;
      if (kernel == (Kernel *)0x0) {
        kernel = (Kernel *)&Specification::_Kernel_default_instance_;
      }
      validateKernel((Result *)local_108,kernel);
      this_00 = &result;
      Result::operator=(this_00,(Result *)local_108);
      std::__cxx11::string::~string((string *)(local_108 + 8));
      bVar3 = Result::good(this_00);
      if (bVar3) {
        uVar1 = pSVar6->_oneof_case_[1];
        if (uVar1 == 0) {
          std::__cxx11::string::string
                    ((string *)local_108,"Int64 class labels must be supplied for SVM classifier.",
                     (allocator *)&local_d8);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_108);
LAB_00229d4a:
          this = (string *)local_108;
        }
        else {
          if (uVar1 == 100) {
            pSVar8 = Specification::SupportVectorClassifier::stringclasslabels(pSVar6);
            this_00 = (Result *)
                      (ulong)(uint)(pSVar8->vector_).super_RepeatedPtrFieldBase.current_size_;
          }
          else if (uVar1 == 0x65) {
            pIVar7 = Specification::SupportVectorClassifier::int64classlabels(pSVar6);
            this_00 = (Result *)(ulong)(uint)(pIVar7->vector_).current_size_;
          }
          local_dc = (pSVar6->coefficients_).super_RepeatedPtrFieldBase.current_size_;
          iVar5 = (int)this_00;
          if (local_dc == iVar5 + -1) {
            if (pSVar6->_oneof_case_[0] == 3) {
              pDVar9 = (DenseSupportVectors *)
                       Specification::SupportVectorClassifier::sparsesupportvectors(pSVar6);
            }
            else {
              if (pSVar6->_oneof_case_[0] != 4) {
                std::__cxx11::string::string
                          ((string *)local_108,"Must specify sparse or dense support vectors",
                           (allocator *)&local_d8);
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_108);
                goto LAB_00229d4a;
              }
              pDVar9 = Specification::SupportVectorClassifier::densesupportvectors(pSVar6);
            }
            if ((pSVar6->numberofsupportvectorsperclass_).current_size_ == iVar5) {
              iVar2 = (pDVar9->vectors_).super_RepeatedPtrFieldBase.current_size_;
              iVar12 = 0;
              iVar11 = 0;
              if (0 < iVar5) {
                iVar11 = iVar5;
              }
              for (index = 0; iVar11 != index; index = index + 1) {
                iVar4 = Specification::SupportVectorClassifier::numberofsupportvectorsperclass
                                  (pSVar6,index);
                iVar12 = iVar12 + iVar4;
              }
              if (iVar2 == iVar12) {
                iVar11 = 0;
                iVar12 = 0;
                if (0 < local_dc) {
                  iVar11 = local_dc;
                  iVar12 = 0;
                }
                for (; iVar11 != iVar12; iVar12 = iVar12 + 1) {
                  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::TypeHandler>
                                      (&(pSVar6->coefficients_).super_RepeatedPtrFieldBase,iVar12);
                  if ((pTVar10->alpha_).current_size_ != iVar2) {
                    std::__cxx11::to_string(&local_98,iVar2);
                    std::operator+(&local_78,"Incorrect number of coefficients: There should be ",
                                   &local_98);
                    std::operator+(&local_d8,&local_78," not ");
                    pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::TypeHandler>
                                        (&(pSVar6->coefficients_).super_RepeatedPtrFieldBase,iVar12)
                    ;
                    std::__cxx11::to_string(&local_b8,(pTVar10->alpha_).current_size_);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_108,&local_d8,&local_b8);
                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                   (string *)local_108);
                    goto LAB_00229f57;
                  }
                }
                iVar2 = (pSVar6->proba_).current_size_;
                iVar11 = (pSVar6->probb_).current_size_;
                if (iVar2 != 0 || iVar11 != 0) {
                  iVar5 = (local_dc * iVar5) / 2;
                  if (iVar2 != iVar11) {
                    std::__cxx11::string::string
                              ((string *)local_108,"probA and probB must be same size",
                               (allocator *)&local_d8);
                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                   (string *)local_108);
                    goto LAB_00229d4a;
                  }
                  if (iVar2 != iVar5) {
                    std::__cxx11::to_string(&local_d8,iVar5);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_108,
                                   "Expected length of probA is number of class pairs: ",&local_d8);
                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                   (string *)local_108);
                    std::__cxx11::string::~string((string *)local_108);
                    this = &local_d8;
                    goto LAB_00229f8a;
                  }
                }
                goto LAB_00229ea3;
              }
              std::__cxx11::to_string(&local_98,iVar12);
              std::operator+(&local_78,"sum of numberOfSupportVectorsPerClass ",&local_98);
              std::operator+(&local_d8,&local_78," must sum to total number of support vectors ");
              std::__cxx11::to_string(&local_b8,iVar2);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108,&local_d8,&local_b8);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_108);
            }
            else {
              std::__cxx11::to_string(&local_98,iVar5);
              std::operator+(&local_78,
                             "numberOfSupportVectoresPerClass array must be size numberOfClasses ",
                             &local_98);
              std::operator+(&local_d8,&local_78," instead it is size ");
              std::__cxx11::to_string
                        (&local_b8,(pSVar6->numberofsupportvectorsperclass_).current_size_);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108,&local_d8,&local_b8);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_108);
            }
          }
          else {
            std::__cxx11::to_string(&local_98,iVar5 + -1);
            std::operator+(&local_78,"coefficient array must be size numberOfClasses - 1 (",
                           &local_98);
            std::operator+(&local_d8,&local_78,"). Instead it is size ");
            std::__cxx11::to_string
                      (&local_b8,(pSVar6->coefficients_).super_RepeatedPtrFieldBase.current_size_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_108,&local_d8,&local_b8);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_108);
          }
LAB_00229f57:
          std::__cxx11::string::~string((string *)local_108);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_78);
          this = &local_98;
        }
LAB_00229f8a:
        std::__cxx11::string::~string((string *)this);
        goto LAB_00229eb3;
      }
    }
  }
LAB_00229ea3:
  Result::Result(__return_storage_ptr__,&result);
LAB_00229eb3:
  std::__cxx11::string::~string((string *)&result.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_supportVectorClassifier>(const Specification::Model& format) {

        const Specification::ModelDescription& description = format.description();

        Result result;

        // Check that inputs are vectorizable
        result = validateDescriptionsAreAllVectorizableTypes(description.input());
        if (!result.good()) {
            return result;
        }

        // Check has a classifier interface
        result = validateClassifierInterface(format, format.supportvectorclassifier());
        if (!result.good()) {
            return result;
        }

        // Validate the params
        const Specification::SupportVectorClassifier& svmSpec = format.supportvectorclassifier();

        result = validateKernel(svmSpec.kernel());
        if (!result.good()) {
            return result;
        }

        // Validate number of coefficients and support vectors are consistent
        int K;
        switch (svmSpec.ClassLabels_case()) {
            case Specification::SupportVectorClassifier::kInt64ClassLabels:
                K = svmSpec.int64classlabels().vector_size();
                break;
            case Specification::SupportVectorClassifier::kStringClassLabels:
                K = svmSpec.stringclasslabels().vector_size();
                break;
            case Specification::SupportVectorClassifier::CLASSLABELS_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Int64 class labels must be supplied for SVM classifier.");
        }

        if (svmSpec.coefficients_size() != K-1) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "coefficient array must be size numberOfClasses - 1 (" +
                                              std::to_string(K-1) +
                                              "). Instead it is size " +
                                              std::to_string(svmSpec.coefficients_size()));
        }

        int totalSVs = 0;
        switch (svmSpec.supportVectors_case()) {
            case Specification::SupportVectorClassifier::kSparseSupportVectors:
                totalSVs = svmSpec.sparsesupportvectors().vectors_size();
                break;
            case Specification::SupportVectorClassifier::kDenseSupportVectors:
                totalSVs = svmSpec.densesupportvectors().vectors_size();
                break;
            default:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Must specify sparse or dense support vectors");
        }

        if(svmSpec.numberofsupportvectorsperclass_size() != K) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "numberOfSupportVectoresPerClass array must be size numberOfClasses " + std::to_string(K) + " instead it is size "
                            +   std::to_string(svmSpec.numberofsupportvectorsperclass_size()));
        }

        int perClassSum = 0;
        for (int c=0; c<K; c++) {
            perClassSum += svmSpec.numberofsupportvectorsperclass(c);
        }

        if (totalSVs != perClassSum) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,

                        "sum of numberOfSupportVectorsPerClass "
                          + std::to_string(perClassSum)
                          + " must sum to total number of support vectors "
                          + std::to_string(totalSVs));
        }

        for (int c=0; c<K-1; c++) {
            if (svmSpec.coefficients(c).alpha_size() != totalSVs) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Incorrect number of coefficients: There should be " +
                                                  std::to_string(totalSVs) +
                                                  " not " +
                                                  std::to_string(svmSpec.coefficients(c).alpha_size()));
            }
        }

        // Validate probA and probB, if given
        if(svmSpec.proba_size() != 0 || svmSpec.probb_size() != 0) {
            int expected_length = K * (K-1) / 2;      // Number of class pairs
            if(svmSpec.proba_size() != svmSpec.probb_size()) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "probA and probB must be same size");
            } else if (svmSpec.proba_size() != expected_length) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Expected length of probA is number of class pairs: " + std::to_string(expected_length));
            }
        }

        return result;
    }